

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOOLEAN.c
# Opt level: O2

asn_enc_rval_t *
BOOLEAN_encode_uper(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  int iVar1;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
  }
  else {
    iVar1 = per_put_few_bits(po,(uint)(*sptr != 0),1);
    if (iVar1 != 0) {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->encoded = 0;
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  }
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
BOOLEAN_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	const BOOLEAN_t *st = (const BOOLEAN_t *)sptr;
	asn_enc_rval_t er = { 0, 0, 0 };

	(void)constraints;

	if(!st) ASN__ENCODE_FAILED;

	if(per_put_few_bits(po, *st ? 1 : 0, 1))
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}